

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O2

bool __thiscall Nibbler::getUntil(Nibbler *this,char c,string *result)

{
  ulong uVar1;
  ulong uVar2;
  size_type sVar3;
  string local_50 [32];
  
  uVar1 = this->_length;
  uVar2 = this->_cursor;
  if (uVar2 < uVar1) {
    sVar3 = std::__cxx11::string::find((char)this,(ulong)(uint)(int)c);
    if (sVar3 == 0xffffffffffffffff) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)this);
      std::__cxx11::string::operator=((string *)result,local_50);
      std::__cxx11::string::~string(local_50);
      sVar3 = this->_length;
    }
    else {
      std::__cxx11::string::substr((ulong)local_50,(ulong)this);
      std::__cxx11::string::operator=((string *)result,local_50);
      std::__cxx11::string::~string(local_50);
    }
    this->_cursor = sVar3;
  }
  return uVar2 < uVar1;
}

Assistant:

bool Nibbler::getUntil (char c, std::string& result)
{
  if (_cursor < _length)
  {
    std::string::size_type i = _input.find (c, _cursor);
    if (i != std::string::npos)
    {
      result = _input.substr (_cursor, i - _cursor);
      _cursor = i;
    }
    else
    {
      result = _input.substr (_cursor);
      _cursor = _length;
    }

    return true;
  }

  return false;
}